

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O0

void __thiscall
hungarian_algorithm::
BruteForceSolver<double,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_std::less<double>,_unsigned_long>
::doSolve(BruteForceSolver<double,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_std::less<double>,_unsigned_long>
          *this,size_t row,CombinedCost *accumulated_cost)

{
  double dVar1;
  unsigned_long uVar2;
  bool bVar3;
  const_reference pdVar4;
  reference puVar5;
  unsigned_long local_88;
  undefined1 local_80 [8];
  CombinedCost new_accumulated_cost_1;
  reference local_60;
  double local_50;
  undefined1 local_48 [8];
  CombinedCost new_accumulated_cost;
  ulong local_28;
  size_t col;
  CombinedCost *accumulated_cost_local;
  size_t row_local;
  BruteForceSolver<double,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_std::less<double>,_unsigned_long>
  *this_local;
  
  if (row < this->num_rows_) {
    for (local_28 = 0; local_28 < this->num_cols_; local_28 = local_28 + 1) {
      join_0x00000010_0x00000000_ =
           std::vector<bool,_std::allocator<bool>_>::operator[](&this->covered_cols_,local_28);
      bVar3 = std::_Bit_reference::operator_cast_to_bool
                        ((_Bit_reference *)&new_accumulated_cost.second);
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        dVar1 = accumulated_cost->second;
        pdVar4 = boost::numeric::ublas::
                 matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                 ::operator()(this->cost_function_,row,local_28);
        local_50 = dVar1 + *pdVar4;
        std::pair<unsigned_long,_double>::pair
                  ((pair<unsigned_long,_double> *)local_48,&accumulated_cost->first,&local_50);
        puVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->current_assignment_,row);
        *puVar5 = local_28;
        local_60 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (&this->covered_cols_,local_28);
        std::_Bit_reference::operator=(&local_60,true);
        doSolve(this,row + 1,(CombinedCost *)local_48);
        join_0x00000010_0x00000000_ =
             std::vector<bool,_std::allocator<bool>_>::operator[](&this->covered_cols_,local_28);
        std::_Bit_reference::operator=((_Bit_reference *)&new_accumulated_cost_1.second,false);
      }
    }
    if (this->num_cols_ < this->num_rows_) {
      local_88 = accumulated_cost->first + 1;
      std::pair<unsigned_long,_double>::pair
                ((pair<unsigned_long,_double> *)local_80,&local_88,&accumulated_cost->second);
      uVar2 = this->num_cols_;
      puVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->current_assignment_,row);
      *puVar5 = uVar2;
      doSolve(this,row + 1,(CombinedCost *)local_80);
    }
  }
  else {
    bVar3 = isBetterThan(this,accumulated_cost,&this->optimal_cost_);
    if (bVar3) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (&this->optimal_assignment_,&this->current_assignment_);
      (this->optimal_cost_).first = accumulated_cost->first;
      (this->optimal_cost_).second = accumulated_cost->second;
    }
  }
  return;
}

Assistant:

void doSolve(const std::size_t row, const CombinedCost& accumulated_cost)
  {
    if (row < num_rows_)
    {
      for (std::size_t col = 0; col < num_cols_; ++col)
      {
        if (!covered_cols_[col])
        {
          const CombinedCost new_accumulated_cost(accumulated_cost.first,
                                                  accumulated_cost.second + cost_function_(Size(row), Size(col)));
          current_assignment_[row] = col;
          covered_cols_[col] = true;
          doSolve(row + 1, new_accumulated_cost);
          covered_cols_[col] = false;
        }
      }

      if (num_cols_ < num_rows_)
      {
        // One possibility is also an invalid assignment:
        const CombinedCost new_accumulated_cost(accumulated_cost.first + 1, accumulated_cost.second);
        current_assignment_[static_cast<std::size_t>(row)] = num_cols_;
        doSolve(row + 1, new_accumulated_cost);
      }
    }
    else if (isBetterThan(accumulated_cost, optimal_cost_))
    {
      optimal_assignment_ = current_assignment_;
      optimal_cost_ = accumulated_cost;
    }
  }